

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,char *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [11],char (*args_2) [6],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [5])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_278;
  cmAlphaNum local_240;
  cmAlphaNum local_208;
  cmAlphaNum local_1d0;
  cmAlphaNum local_198;
  cmAlphaNum local_160;
  cmAlphaNum local_128;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [6];
  char (*args_local_2) [6];
  char (*args_local_1) [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char *b_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [6])args_1;
  args_local_1 = (char (*) [11])args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b;
  b_local = (char *)a;
  a_local = __return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_128,a);
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_f0,
             &cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const&[],char_const&[],std::__cxx11::string&,char_const&[])
              ::makePair,&local_128);
  cmAlphaNum::cmAlphaNum(&local_160,(char)args_local->_M_dataplus);
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_d8,
             &cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const&[],char_const&[],std::__cxx11::string&,char_const&[])
              ::makePair,&local_160);
  cmAlphaNum::cmAlphaNum(&local_198,(string *)args_local_1);
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const&[],char_const&[],std::__cxx11::string&,char_const&[])
              ::makePair,&local_198);
  cmAlphaNum::cmAlphaNum(&local_1d0,*args_local_2);
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const&[],char_const&[],std::__cxx11::string&,char_const&[])
              ::makePair,&local_1d0);
  cmAlphaNum::cmAlphaNum(&local_208,*local_38);
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const&[],char_const&[],std::__cxx11::string&,char_const&[])
              ::makePair,&local_208);
  cmAlphaNum::cmAlphaNum(&local_240,args_3);
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const&[],char_const&[],std::__cxx11::string&,char_const&[])
              ::makePair,&local_240);
  cmAlphaNum::cmAlphaNum(&local_278,*args_4);
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>(std::__cxx11::string&,char&&,std::__cxx11::string&,char_const&[],char_const&[],std::__cxx11::string&,char_const&[])
              ::makePair,&local_278);
  local_48 = &local_f0;
  local_40 = 7;
  views._M_len = 7;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}